

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Object>
          (Structure *this,Object *dest,FileDatabase *db)

{
  int temp;
  shared_ptr<Assimp::Blender::Object> parent;
  Type local_3c;
  shared_ptr<Assimp::Blender::Object> local_38;
  
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  local_3c = Type_EMPTY;
  ReadField<2,int>(this,(int *)&local_3c,"type",db);
  dest->type = local_3c;
  ReadFieldArray2<1,float,4ul,4ul>(this,&dest->obmat,"obmat",db);
  ReadFieldArray2<1,float,4ul,4ul>(this,&dest->parentinv,"parentinv",db);
  ReadFieldArray<1,char,32ul>(this,&dest->parsubstr,"parsubstr",db);
  local_38.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (Object *)0x0;
  local_38.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&local_38,"*parent",db,false);
  dest->parent = local_38.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->track,"*track",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>(this,&dest->proxy,"*proxy",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,&dest->proxy_from,"*proxy_from",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,&dest->proxy_group,"*proxy_group",db,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Group>
            (this,&dest->dup_group,"*dup_group",db,false);
  ReadFieldPtr<2,std::shared_ptr,Assimp::Blender::ElemBase>(this,&dest->data,"*data",db,false);
  ReadField<1,Assimp::Blender::ListBase>(this,&dest->modifiers,"modifiers",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Object> (
    Object& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Object::Type>(temp);
    ReadFieldArray2<ErrorPolicy_Warn>(dest.obmat,"obmat",db);
    ReadFieldArray2<ErrorPolicy_Warn>(dest.parentinv,"parentinv",db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.parsubstr,"parsubstr",db);
    {
        std::shared_ptr<Object> parent;
        ReadFieldPtr<ErrorPolicy_Warn>(parent,"*parent",db);
        dest.parent = parent.get();
    }
    ReadFieldPtr<ErrorPolicy_Warn>(dest.track,"*track",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy,"*proxy",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy_from,"*proxy_from",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.proxy_group,"*proxy_group",db);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.dup_group,"*dup_group",db);
    ReadFieldPtr<ErrorPolicy_Fail>(dest.data,"*data",db);
    ReadField<ErrorPolicy_Igno>(dest.modifiers,"modifiers",db);

    db.reader->IncPtr(size);
}